

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

If_Obj_t * If_ManSetupObj(If_Man_t *p)

{
  int iVar1;
  If_Obj_t *__s;
  If_Obj_t *pObj;
  If_Man_t *p_local;
  
  __s = (If_Obj_t *)Mem_FixedEntryFetch(p->pMemObj);
  memset(__s,0,0x70);
  If_CutSetup(p,&__s->CutBest);
  iVar1 = Vec_PtrSize(p->vObjs);
  __s->Id = iVar1;
  Vec_PtrPush(p->vObjs,__s);
  __s->Required = 1e+20;
  return __s;
}

Assistant:

If_Obj_t * If_ManSetupObj( If_Man_t * p )
{
    If_Obj_t * pObj;
    // get memory for the object
    pObj = (If_Obj_t *)Mem_FixedEntryFetch( p->pMemObj );
    memset( pObj, 0, sizeof(If_Obj_t) );
    If_CutSetup( p, &pObj->CutBest );
    // assign ID and save 
    pObj->Id = Vec_PtrSize(p->vObjs);
    Vec_PtrPush( p->vObjs, pObj );
    // set the required times
    pObj->Required = IF_FLOAT_LARGE;
    return pObj;
}